

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O3

void av1_compute_stats_sse4_1
               (int wiener_win,uint8_t *dgd,uint8_t *src,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,int use_downsampled_wiener_stats)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [12];
  int iVar7;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  int iVar11;
  long *plVar12;
  long lVar13;
  ulong uVar14;
  undefined1 *puVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int *piVar20;
  long lVar21;
  undefined1 *puVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  uint8_t *puVar26;
  int64_t *piVar27;
  long lVar28;
  ushort uVar29;
  int iVar30;
  uint8_t *puVar31;
  ulong uVar32;
  int64_t *piVar33;
  undefined1 *puVar34;
  undefined1 *puVar35;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar36 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar57 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int32_t sumY [7] [7];
  int32_t M_int32 [7] [7];
  int64_t M_int64 [7] [7];
  int32_t H_int32 [49] [56];
  int64_t H_int64 [49] [56];
  int local_b214;
  undefined1 local_b1e8 [352];
  undefined1 local_b088 [16];
  undefined1 local_b078 [16];
  undefined1 local_b068 [16];
  undefined1 local_b058 [16];
  undefined1 local_b048 [16];
  undefined1 local_b038 [16];
  undefined4 local_b028;
  undefined1 local_afb8 [16];
  undefined1 local_afa8 [16];
  undefined1 local_af98 [16];
  undefined1 local_af88 [16];
  undefined1 local_af78 [16];
  undefined1 local_af68 [16];
  undefined4 local_af58;
  undefined1 local_aee8 [16];
  undefined1 local_aed8 [16];
  undefined1 local_aec8 [16];
  undefined1 local_aeb8 [16];
  undefined1 local_aea8 [16];
  undefined1 local_ae98 [16];
  undefined4 local_ae88;
  undefined1 local_ae18 [16];
  undefined1 local_ae08 [16];
  undefined1 local_adf8 [16];
  undefined1 local_ade8 [16];
  undefined1 local_add8 [16];
  undefined1 local_adc8 [16];
  undefined4 local_adb8;
  long local_ad48 [50];
  undefined1 local_abb8 [144];
  int local_ab28 [16];
  int local_aae8 [2692];
  undefined1 local_80d8 [10976];
  undefined1 local_55f8 [21960];
  
  if (wiener_win == 5) {
    iVar23 = 0;
    if (v_start < v_end) {
      lVar25 = (long)v_start;
      puVar26 = dgd + dgd_stride * lVar25;
      uVar8 = 0;
      do {
        lVar21 = (long)h_start;
        if (h_start < h_end) {
          do {
            uVar8 = uVar8 + puVar26[lVar21];
            lVar21 = lVar21 + 1;
          } while (h_end != lVar21);
        }
        lVar25 = lVar25 + 1;
        puVar26 = puVar26 + dgd_stride;
      } while (lVar25 != v_end);
    }
    else {
      uVar8 = 0;
    }
    uVar32 = (ulong)((v_end - v_start) * (h_end - h_start));
    local_adb8 = 0;
    local_adc8 = (undefined1  [16])0x0;
    local_add8 = (undefined1  [16])0x0;
    local_ade8 = (undefined1  [16])0x0;
    local_adf8 = (undefined1  [16])0x0;
    local_ae08 = (undefined1  [16])0x0;
    local_ae18 = (undefined1  [16])0x0;
    memset(local_ad48,0,200);
    memset(local_80d8,0,4000);
    memset(local_55f8,0,8000);
    local_af58 = 0;
    local_af68 = (undefined1  [16])0x0;
    local_af78 = (undefined1  [16])0x0;
    local_af88 = (undefined1  [16])0x0;
    local_af98 = (undefined1  [16])0x0;
    local_afa8 = (undefined1  [16])0x0;
    local_afb8 = (undefined1  [16])0x0;
    if (v_start < v_end) {
      uVar14 = (ulong)(dgd_stride * 2);
      iVar17 = (uint)(use_downsampled_wiener_stats != 0) * 3 + 1;
      lVar25 = (long)dgd_stride;
      iVar23 = 0;
      auVar37 = extraout_XMM0_00;
      do {
        iVar7 = v_end - v_start;
        iVar11 = 0x40;
        if (iVar7 < 0x40) {
          iVar11 = iVar7;
        }
        if (0 < iVar7) {
          iVar7 = v_start;
          iVar18 = iVar17;
          do {
            iVar17 = (iVar11 + v_start) - iVar7;
            if (3 < iVar17) {
              iVar17 = iVar18;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar17 = iVar18;
            }
            local_b028 = 0;
            local_b038 = (undefined1  [16])0x0;
            local_b048 = (undefined1  [16])0x0;
            local_b058 = (undefined1  [16])0x0;
            local_b068 = (undefined1  [16])0x0;
            local_b078 = (undefined1  [16])0x0;
            local_b088 = (undefined1  [16])0x0;
            local_aee8 = (undefined1  [16])0x0;
            local_aed8 = (undefined1  [16])0x0;
            local_aec8 = (undefined1  [16])0x0;
            local_aeb8 = (undefined1  [16])0x0;
            local_aea8 = (undefined1  [16])0x0;
            local_ae98 = (undefined1  [16])0x0;
            auVar6 = local_b1e8._4_12_;
            auVar50._12_4_ = 0;
            auVar50._0_12_ = local_b1e8._4_12_;
            local_b1e8._0_16_ = auVar50 << 0x20;
            local_ae88 = 0;
            memset(local_abb8,0,4000);
            lVar21 = (long)(iVar7 * dgd_stride) + (-2 - uVar14);
            iVar18 = iVar7 * src_stride;
            uVar16 = (ulong)(uint)h_start;
            if (h_start < (int)(h_end & 0xfffffffeU)) {
              puVar26 = dgd + (long)(iVar7 * dgd_stride) + ~uVar14 + (long)h_start;
              auVar51._12_4_ = 0;
              auVar51._0_12_ = auVar6;
              local_b1e8._0_16_ = auVar51 << 0x20;
              uVar16 = (long)h_start;
              do {
                lVar28 = uVar16 + lVar21;
                bVar1 = src[uVar16 + (long)iVar18];
                bVar2 = src[uVar16 + (long)iVar18 + 1];
                auVar37 = pshufb(*(undefined1 (*) [16])(dgd + uVar16 + lVar21),_DAT_0050da40);
                in_XMM1 = pmovzxbw(in_XMM1,auVar37);
                auVar52[1] = 0;
                auVar52[0] = auVar37[8];
                auVar52[2] = auVar37[9];
                auVar52[3] = 0;
                auVar52[4] = auVar37[10];
                auVar52[5] = 0;
                auVar52[6] = auVar37[0xb];
                auVar52[7] = 0;
                auVar52[8] = auVar37[0xc];
                auVar52[9] = 0;
                auVar52[10] = auVar37[0xd];
                auVar52[0xb] = 0;
                auVar52[0xc] = auVar37[0xe];
                auVar52[0xd] = 0;
                auVar52[0xe] = auVar37[0xf];
                auVar52[0xf] = 0;
                auVar37 = pshufb(*(undefined1 (*) [16])(dgd + lVar25 + lVar28),_DAT_0050da40);
                in_XMM3 = pmovzxbw(in_XMM3,auVar37);
                auVar53[1] = 0;
                auVar53[0] = auVar37[8];
                auVar53[2] = auVar37[9];
                auVar53[3] = 0;
                auVar53[4] = auVar37[10];
                auVar53[5] = 0;
                auVar53[6] = auVar37[0xb];
                auVar53[7] = 0;
                auVar53[8] = auVar37[0xc];
                auVar53[9] = 0;
                auVar53[10] = auVar37[0xd];
                auVar53[0xb] = 0;
                auVar53[0xc] = auVar37[0xe];
                auVar53[0xd] = 0;
                auVar53[0xe] = auVar37[0xf];
                auVar53[0xf] = 0;
                auVar37 = pshufb(*(undefined1 (*) [16])(dgd + uVar14 + lVar28),_DAT_0050da40);
                in_XMM5 = pmovzxbw(in_XMM5,auVar37);
                auVar54[1] = 0;
                auVar54[0] = auVar37[8];
                auVar54[2] = auVar37[9];
                auVar54[3] = 0;
                auVar54[4] = auVar37[10];
                auVar54[5] = 0;
                auVar54[6] = auVar37[0xb];
                auVar54[7] = 0;
                auVar54[8] = auVar37[0xc];
                auVar54[9] = 0;
                auVar54[10] = auVar37[0xd];
                auVar54[0xb] = 0;
                auVar54[0xc] = auVar37[0xe];
                auVar54[0xd] = 0;
                auVar54[0xe] = auVar37[0xf];
                auVar54[0xf] = 0;
                auVar37 = pshufb(*(undefined1 (*) [16])(dgd + lVar25 * 3 + lVar28),_DAT_0050da40);
                in_XMM7 = pmovzxbw(in_XMM7,auVar37);
                auVar60[1] = 0;
                auVar60[0] = auVar37[8];
                auVar60[2] = auVar37[9];
                auVar60[3] = 0;
                auVar60[4] = auVar37[10];
                auVar60[5] = 0;
                auVar60[6] = auVar37[0xb];
                auVar60[7] = 0;
                auVar60[8] = auVar37[0xc];
                auVar60[9] = 0;
                auVar60[10] = auVar37[0xd];
                auVar60[0xb] = 0;
                auVar60[0xc] = auVar37[0xe];
                auVar60[0xd] = 0;
                auVar60[0xe] = auVar37[0xf];
                auVar60[0xf] = 0;
                auVar37 = pshufb(*(undefined1 (*) [16])(dgd + lVar25 * 4 + lVar28),_DAT_0050da40);
                in_XMM9 = pmovzxbw(in_XMM9,auVar37);
                auVar59[1] = 0;
                auVar59[0] = auVar37[8];
                auVar59[2] = auVar37[9];
                auVar59[3] = 0;
                auVar59[4] = auVar37[10];
                auVar59[5] = 0;
                auVar59[6] = auVar37[0xb];
                auVar59[7] = 0;
                auVar59[8] = auVar37[0xc];
                auVar59[9] = 0;
                auVar59[10] = auVar37[0xd];
                auVar59[0xb] = 0;
                auVar59[0xc] = auVar37[0xe];
                auVar59[0xd] = 0;
                auVar59[0xe] = auVar37[0xf];
                auVar59[0xf] = 0;
                piVar10 = local_ab28;
                puVar35 = local_b088;
                puVar34 = local_aee8;
                lVar24 = 0;
                puVar31 = puVar26;
                do {
                  uVar19 = (uint)dgd[lVar24 * lVar25 + lVar28];
                  lVar9 = 0;
                  piVar20 = piVar10;
                  do {
                    bVar3 = puVar31[lVar9];
                    *(uint *)(puVar35 + lVar9 * 4) = *(int *)(puVar35 + lVar9 * 4) + bVar3 + uVar19;
                    *(uint *)(puVar34 + lVar9 * 4) =
                         *(int *)(puVar34 + lVar9 * 4) + (uint)bVar3 * (uint)bVar2 + uVar19 * bVar1;
                    uVar29 = *(ushort *)(puVar31 + lVar9 + -1);
                    auVar37 = pshuflw(ZEXT216(uVar29),ZEXT216(uVar29),0);
                    auVar37 = pmovzxbw(auVar37,auVar37);
                    auVar50 = pmaddwd(auVar37,in_XMM1);
                    auVar51 = pmaddwd(auVar37,auVar52);
                    piVar20[-0x24] = auVar50._0_4_ + piVar20[-0x24];
                    piVar20[-0x23] = auVar50._4_4_ + piVar20[-0x23];
                    piVar20[-0x22] = auVar50._8_4_ + piVar20[-0x22];
                    piVar20[-0x21] = auVar50._12_4_ + piVar20[-0x21];
                    piVar20[-0x20] = auVar51._0_4_ + piVar20[-0x20];
                    piVar20[-0x1f] = auVar51._4_4_ + piVar20[-0x1f];
                    piVar20[-0x1e] = auVar51._8_4_ + piVar20[-0x1e];
                    piVar20[-0x1d] = auVar51._12_4_ + piVar20[-0x1d];
                    auVar50 = pmaddwd(auVar37,in_XMM3);
                    auVar51 = pmaddwd(auVar37,auVar53);
                    piVar20[-0x1c] = auVar50._0_4_ + piVar20[-0x1c];
                    piVar20[-0x1b] = auVar50._4_4_ + piVar20[-0x1b];
                    piVar20[-0x1a] = auVar50._8_4_ + piVar20[-0x1a];
                    piVar20[-0x19] = auVar50._12_4_ + piVar20[-0x19];
                    piVar20[-0x18] = auVar51._0_4_ + piVar20[-0x18];
                    piVar20[-0x17] = auVar51._4_4_ + piVar20[-0x17];
                    piVar20[-0x16] = auVar51._8_4_ + piVar20[-0x16];
                    piVar20[-0x15] = auVar51._12_4_ + piVar20[-0x15];
                    auVar50 = pmaddwd(auVar37,in_XMM5);
                    auVar51 = pmaddwd(auVar37,auVar54);
                    piVar20[-0x14] = auVar50._0_4_ + piVar20[-0x14];
                    piVar20[-0x13] = auVar50._4_4_ + piVar20[-0x13];
                    piVar20[-0x12] = auVar50._8_4_ + piVar20[-0x12];
                    piVar20[-0x11] = auVar50._12_4_ + piVar20[-0x11];
                    piVar20[-0x10] = auVar51._0_4_ + piVar20[-0x10];
                    piVar20[-0xf] = auVar51._4_4_ + piVar20[-0xf];
                    piVar20[-0xe] = auVar51._8_4_ + piVar20[-0xe];
                    piVar20[-0xd] = auVar51._12_4_ + piVar20[-0xd];
                    auVar50 = pmaddwd(auVar37,in_XMM7);
                    auVar51 = pmaddwd(auVar37,auVar60);
                    lVar9 = lVar9 + 1;
                    piVar20[-0xc] = auVar50._0_4_ + piVar20[-0xc];
                    piVar20[-0xb] = auVar50._4_4_ + piVar20[-0xb];
                    piVar20[-10] = auVar50._8_4_ + piVar20[-10];
                    piVar20[-9] = auVar50._12_4_ + piVar20[-9];
                    piVar20[-8] = auVar51._0_4_ + piVar20[-8];
                    piVar20[-7] = auVar51._4_4_ + piVar20[-7];
                    piVar20[-6] = auVar51._8_4_ + piVar20[-6];
                    piVar20[-5] = auVar51._12_4_ + piVar20[-5];
                    auVar50 = pmaddwd(auVar37,in_XMM9);
                    auVar37 = pmaddwd(auVar37,auVar59);
                    piVar20[-4] = auVar50._0_4_ + piVar20[-4];
                    piVar20[-3] = auVar50._4_4_ + piVar20[-3];
                    piVar20[-2] = auVar50._8_4_ + piVar20[-2];
                    piVar20[-1] = auVar50._12_4_ + piVar20[-1];
                    *piVar20 = auVar37._0_4_ + *piVar20;
                    piVar20[1] = auVar37._4_4_ + piVar20[1];
                    piVar20[2] = auVar37._8_4_ + piVar20[2];
                    piVar20[3] = auVar37._12_4_ + piVar20[3];
                    uVar19 = (uint)(uVar29 >> 8);
                    piVar20 = piVar20 + 200;
                  } while (lVar9 != 5);
                  lVar24 = lVar24 + 1;
                  puVar34 = puVar34 + 0x14;
                  puVar35 = puVar35 + 0x14;
                  puVar31 = puVar31 + lVar25;
                  piVar10 = piVar10 + 0x28;
                } while (lVar24 != 5);
                local_b1e8._0_4_ = local_b1e8._0_4_ + (uint)bVar1 + (uint)bVar2;
                uVar16 = uVar16 + 2;
                puVar26 = puVar26 + 2;
              } while ((long)uVar16 < (long)(int)(h_end & 0xfffffffeU));
            }
            iVar30 = local_b1e8._0_4_;
            if ((h_end & 1U) != 0) {
              lVar28 = (long)(int)uVar16;
              puVar26 = dgd + lVar28 + lVar21;
              bVar1 = src[lVar28 + iVar18];
              auVar37 = pshufb(*(undefined1 (*) [16])(dgd + lVar28 + lVar21),_DAT_0050da40);
              auVar50 = pmovzxbw(in_XMM1,auVar37);
              auVar62[1] = 0;
              auVar62[0] = auVar37[8];
              auVar62[2] = auVar37[9];
              auVar62[3] = 0;
              auVar62[4] = auVar37[10];
              auVar62[5] = 0;
              auVar62[6] = auVar37[0xb];
              auVar62[7] = 0;
              auVar62[8] = auVar37[0xc];
              auVar62[9] = 0;
              auVar62[10] = auVar37[0xd];
              auVar62[0xb] = 0;
              auVar62[0xc] = auVar37[0xe];
              auVar62[0xd] = 0;
              auVar62[0xe] = auVar37[0xf];
              auVar62[0xf] = 0;
              auVar37 = pshufb(*(undefined1 (*) [16])(puVar26 + lVar25),_DAT_0050da40);
              in_XMM3 = pmovzxbw(in_XMM3,auVar37);
              auVar55[1] = 0;
              auVar55[0] = auVar37[8];
              auVar55[2] = auVar37[9];
              auVar55[3] = 0;
              auVar55[4] = auVar37[10];
              auVar55[5] = 0;
              auVar55[6] = auVar37[0xb];
              auVar55[7] = 0;
              auVar55[8] = auVar37[0xc];
              auVar55[9] = 0;
              auVar55[10] = auVar37[0xd];
              auVar55[0xb] = 0;
              auVar55[0xc] = auVar37[0xe];
              auVar55[0xd] = 0;
              auVar55[0xe] = auVar37[0xf];
              auVar55[0xf] = 0;
              auVar37 = pshufb(*(undefined1 (*) [16])(puVar26 + uVar14),_DAT_0050da40);
              in_XMM5 = pmovzxbw(in_XMM5,auVar37);
              auVar56[1] = 0;
              auVar56[0] = auVar37[8];
              auVar56[2] = auVar37[9];
              auVar56[3] = 0;
              auVar56[4] = auVar37[10];
              auVar56[5] = 0;
              auVar56[6] = auVar37[0xb];
              auVar56[7] = 0;
              auVar56[8] = auVar37[0xc];
              auVar56[9] = 0;
              auVar56[10] = auVar37[0xd];
              auVar56[0xb] = 0;
              auVar56[0xc] = auVar37[0xe];
              auVar56[0xd] = 0;
              auVar56[0xe] = auVar37[0xf];
              auVar56[0xf] = 0;
              auVar37 = pshufb(*(undefined1 (*) [16])(puVar26 + lVar25 * 3),_DAT_0050da40);
              in_XMM7 = pmovzxbw(in_XMM7,auVar37);
              auVar57[1] = 0;
              auVar57[0] = auVar37[8];
              auVar57[2] = auVar37[9];
              auVar57[3] = 0;
              auVar57[4] = auVar37[10];
              auVar57[5] = 0;
              auVar57[6] = auVar37[0xb];
              auVar57[7] = 0;
              auVar57[8] = auVar37[0xc];
              auVar57[9] = 0;
              auVar57[10] = auVar37[0xd];
              auVar57[0xb] = 0;
              auVar57[0xc] = auVar37[0xe];
              auVar57[0xd] = 0;
              auVar57[0xe] = auVar37[0xf];
              auVar57[0xf] = 0;
              auVar37 = pshufb(*(undefined1 (*) [16])(puVar26 + lVar25 * 4),_DAT_0050da40);
              in_XMM9 = pmovzxbw(in_XMM9,auVar37);
              auVar58[1] = 0;
              auVar58[0] = auVar37[8];
              auVar58[2] = auVar37[9];
              auVar58[3] = 0;
              auVar58[4] = auVar37[10];
              auVar58[5] = 0;
              auVar58[6] = auVar37[0xb];
              auVar58[7] = 0;
              auVar58[8] = auVar37[0xc];
              auVar58[9] = 0;
              auVar58[10] = auVar37[0xd];
              auVar58[0xb] = 0;
              auVar58[0xc] = auVar37[0xe];
              auVar58[0xd] = 0;
              auVar58[0xe] = auVar37[0xf];
              auVar58[0xf] = 0;
              piVar10 = local_ab28;
              puVar35 = local_b088;
              puVar34 = local_aee8;
              lVar21 = 0;
              do {
                lVar28 = 0;
                piVar20 = piVar10;
                do {
                  uVar29 = (ushort)puVar26[lVar28];
                  *(uint *)(puVar35 + lVar28 * 4) = *(int *)(puVar35 + lVar28 * 4) + (uint)uVar29;
                  *(uint *)(puVar34 + lVar28 * 4) =
                       *(int *)(puVar34 + lVar28 * 4) + (uint)uVar29 * (uint)bVar1;
                  auVar37 = pshuflw(ZEXT216(uVar29),ZEXT216(uVar29),0);
                  auVar37 = pmovzxbw(auVar37,auVar37);
                  auVar51 = pmaddwd(auVar37,auVar50);
                  auVar52 = pmaddwd(auVar37,auVar62);
                  piVar20[-0x24] = auVar51._0_4_ + piVar20[-0x24];
                  piVar20[-0x23] = auVar51._4_4_ + piVar20[-0x23];
                  piVar20[-0x22] = auVar51._8_4_ + piVar20[-0x22];
                  piVar20[-0x21] = auVar51._12_4_ + piVar20[-0x21];
                  piVar20[-0x20] = auVar52._0_4_ + piVar20[-0x20];
                  piVar20[-0x1f] = auVar52._4_4_ + piVar20[-0x1f];
                  piVar20[-0x1e] = auVar52._8_4_ + piVar20[-0x1e];
                  piVar20[-0x1d] = auVar52._12_4_ + piVar20[-0x1d];
                  auVar51 = pmaddwd(auVar37,in_XMM3);
                  auVar52 = pmaddwd(auVar37,auVar55);
                  piVar20[-0x1c] = auVar51._0_4_ + piVar20[-0x1c];
                  piVar20[-0x1b] = auVar51._4_4_ + piVar20[-0x1b];
                  piVar20[-0x1a] = auVar51._8_4_ + piVar20[-0x1a];
                  piVar20[-0x19] = auVar51._12_4_ + piVar20[-0x19];
                  piVar20[-0x18] = auVar52._0_4_ + piVar20[-0x18];
                  piVar20[-0x17] = auVar52._4_4_ + piVar20[-0x17];
                  piVar20[-0x16] = auVar52._8_4_ + piVar20[-0x16];
                  piVar20[-0x15] = auVar52._12_4_ + piVar20[-0x15];
                  auVar51 = pmaddwd(auVar37,in_XMM5);
                  auVar52 = pmaddwd(auVar37,auVar56);
                  piVar20[-0x14] = auVar51._0_4_ + piVar20[-0x14];
                  piVar20[-0x13] = auVar51._4_4_ + piVar20[-0x13];
                  piVar20[-0x12] = auVar51._8_4_ + piVar20[-0x12];
                  piVar20[-0x11] = auVar51._12_4_ + piVar20[-0x11];
                  piVar20[-0x10] = auVar52._0_4_ + piVar20[-0x10];
                  piVar20[-0xf] = auVar52._4_4_ + piVar20[-0xf];
                  piVar20[-0xe] = auVar52._8_4_ + piVar20[-0xe];
                  piVar20[-0xd] = auVar52._12_4_ + piVar20[-0xd];
                  auVar51 = pmaddwd(auVar37,in_XMM7);
                  auVar52 = pmaddwd(auVar37,auVar57);
                  piVar20[-0xc] = auVar51._0_4_ + piVar20[-0xc];
                  piVar20[-0xb] = auVar51._4_4_ + piVar20[-0xb];
                  piVar20[-10] = auVar51._8_4_ + piVar20[-10];
                  piVar20[-9] = auVar51._12_4_ + piVar20[-9];
                  piVar20[-8] = auVar52._0_4_ + piVar20[-8];
                  piVar20[-7] = auVar52._4_4_ + piVar20[-7];
                  piVar20[-6] = auVar52._8_4_ + piVar20[-6];
                  piVar20[-5] = auVar52._12_4_ + piVar20[-5];
                  auVar51 = pmaddwd(auVar37,in_XMM9);
                  auVar37 = pmaddwd(auVar37,auVar58);
                  piVar20[-4] = auVar51._0_4_ + piVar20[-4];
                  piVar20[-3] = auVar51._4_4_ + piVar20[-3];
                  piVar20[-2] = auVar51._8_4_ + piVar20[-2];
                  piVar20[-1] = auVar51._12_4_ + piVar20[-1];
                  *piVar20 = auVar37._0_4_ + *piVar20;
                  piVar20[1] = auVar37._4_4_ + piVar20[1];
                  piVar20[2] = auVar37._8_4_ + piVar20[2];
                  piVar20[3] = auVar37._12_4_ + piVar20[3];
                  lVar28 = lVar28 + 1;
                  piVar20 = piVar20 + 200;
                } while (lVar28 != 5);
                lVar21 = lVar21 + 1;
                puVar34 = puVar34 + 0x14;
                puVar35 = puVar35 + 0x14;
                puVar26 = puVar26 + lVar25;
                piVar10 = piVar10 + 0x28;
              } while (lVar21 != 5);
              iVar30 = local_b1e8._0_4_ + (uint)bVar1;
            }
            puVar35 = local_b088;
            puVar34 = local_afb8;
            puVar15 = local_aee8;
            puVar22 = local_ae18;
            lVar21 = 0;
            do {
              lVar28 = 0;
              do {
                *(int *)(puVar34 + lVar28 * 4) =
                     *(int *)(puVar34 + lVar28 * 4) + *(int *)(puVar35 + lVar28 * 4) * iVar17;
                *(int *)(puVar22 + lVar28 * 4) =
                     *(int *)(puVar22 + lVar28 * 4) + *(int *)(puVar15 + lVar28 * 4) * iVar17;
                lVar28 = lVar28 + 1;
              } while (lVar28 != 5);
              lVar21 = lVar21 + 1;
              puVar22 = puVar22 + 0x14;
              puVar15 = puVar15 + 0x14;
              puVar34 = puVar34 + 0x14;
              puVar35 = puVar35 + 0x14;
            } while (lVar21 != 5);
            auVar37._4_4_ = iVar17;
            auVar37._0_4_ = iVar17;
            auVar37._8_4_ = iVar17;
            auVar37._12_4_ = iVar17;
            puVar35 = local_80d8;
            puVar34 = local_abb8;
            lVar21 = 0;
            do {
              lVar28 = 0;
              do {
                auVar50 = pmulld(*(undefined1 (*) [16])(puVar34 + lVar28 * 4),auVar37);
                piVar10 = (int *)(puVar35 + lVar28 * 4);
                in_XMM1._0_4_ = auVar50._0_4_ + *piVar10;
                in_XMM1._4_4_ = auVar50._4_4_ + piVar10[1];
                in_XMM1._8_4_ = auVar50._8_4_ + piVar10[2];
                in_XMM1._12_4_ = auVar50._12_4_ + piVar10[3];
                *(undefined1 (*) [16])(puVar35 + lVar28 * 4) = in_XMM1;
                lVar28 = lVar28 + 4;
              } while (lVar28 != 0x28);
              lVar21 = lVar21 + 1;
              puVar34 = puVar34 + 0xa0;
              puVar35 = puVar35 + 0xa0;
            } while (lVar21 != 0x19);
            iVar23 = iVar23 + iVar30 * iVar17;
            iVar7 = iVar7 + iVar17;
            iVar18 = iVar17;
          } while (iVar7 < iVar11 + v_start);
        }
        puVar35 = local_ae18;
        plVar12 = local_ad48;
        lVar21 = 0;
        do {
          lVar28 = 0;
          do {
            plVar12[lVar28] = plVar12[lVar28] + (long)*(int *)(puVar35 + lVar28 * 4);
            *(undefined4 *)(puVar35 + lVar28 * 4) = 0;
            lVar28 = lVar28 + 1;
          } while (lVar28 != 5);
          lVar21 = lVar21 + 1;
          plVar12 = plVar12 + 5;
          puVar35 = puVar35 + 0x14;
        } while (lVar21 != 5);
        puVar35 = local_55f8;
        puVar34 = local_80d8;
        lVar21 = 0;
        do {
          lVar28 = 0;
          do {
            auVar50 = pmovsxdq(auVar37,*(undefined8 *)(puVar34 + lVar28 * 4));
            auVar37._0_8_ = auVar50._0_8_ + *(long *)(puVar35 + lVar28 * 8);
            auVar37._8_8_ = auVar50._8_8_ + *(long *)((long)(puVar35 + lVar28 * 8) + 8);
            *(undefined1 (*) [16])(puVar35 + lVar28 * 8) = auVar37;
            *(undefined8 *)(puVar34 + lVar28 * 4) = 0;
            lVar28 = lVar28 + 2;
          } while (lVar28 != 0x28);
          lVar21 = lVar21 + 1;
          puVar34 = puVar34 + 0xa0;
          puVar35 = puVar35 + 0x140;
        } while (lVar21 != 0x19);
        v_start = v_start + 0x40;
      } while (v_start < v_end);
    }
    uVar8 = uVar8 / uVar32 & 0xff;
    lVar21 = uVar32 * uVar8 * uVar8;
    lVar25 = 0;
    puVar35 = local_55f8;
    do {
      lVar28 = 0;
      puVar34 = puVar35;
      piVar27 = H;
      do {
        iVar17 = *(int *)(local_afb8 + lVar28 * 4 + lVar25 * 0x14);
        M[lVar28 * 5 + lVar25] =
             (local_ad48[lVar25 * 5 + lVar28] + lVar21) - ((long)iVar17 + (long)iVar23) * uVar8;
        piVar10 = (int *)local_afb8;
        lVar24 = 0;
        piVar33 = piVar27;
        puVar15 = puVar34;
        do {
          lVar9 = 0;
          piVar20 = piVar10;
          do {
            *(ulong *)((long)piVar33 + lVar9) =
                 (*(long *)(puVar15 + lVar9 * 8) + lVar21) - ((long)*piVar20 + (long)iVar17) * uVar8
            ;
            lVar9 = lVar9 + 8;
            piVar20 = piVar20 + 5;
          } while (lVar9 != 0x28);
          lVar24 = lVar24 + 1;
          piVar33 = piVar33 + 5;
          piVar10 = piVar10 + 1;
          puVar15 = puVar15 + 8;
        } while (lVar24 != 5);
        lVar28 = lVar28 + 1;
        piVar27 = piVar27 + 0x7d;
        puVar34 = puVar34 + 0x640;
      } while (lVar28 != 5);
      lVar25 = lVar25 + 1;
      H = H + 0x19;
      puVar35 = puVar35 + 0x140;
    } while (lVar25 != 5);
  }
  else {
    if (wiener_win != 7) {
      av1_compute_stats_c(wiener_win,dgd,src,dgd_avg,src_avg,h_start,h_end,v_start,v_end,dgd_stride,
                          src_stride,M,H,use_downsampled_wiener_stats);
      return;
    }
    lVar25 = (long)dgd_stride;
    if (v_start < v_end) {
      lVar21 = (long)v_start;
      puVar26 = dgd + lVar25 * lVar21;
      uVar8 = 0;
      do {
        lVar28 = (long)h_start;
        if (h_start < h_end) {
          do {
            uVar8 = uVar8 + puVar26[lVar28];
            lVar28 = lVar28 + 1;
          } while (h_end != lVar28);
        }
        lVar21 = lVar21 + 1;
        puVar26 = puVar26 + lVar25;
      } while (lVar21 != v_end);
    }
    else {
      uVar8 = 0;
    }
    uVar32 = (ulong)((v_end - v_start) * (h_end - h_start));
    memset(local_ae18,0,0xc4);
    memset(local_ad48,0,0x188);
    memset(local_80d8,0,0x2ae0);
    memset(local_55f8,0,0x55c0);
    memset(local_afb8,0,0xc4);
    iVar23 = 0;
    if (v_start < v_end) {
      lVar21 = (long)(dgd_stride * 3);
      iVar17 = (uint)(use_downsampled_wiener_stats != 0) * 3 + 1;
      iVar23 = 0;
      auVar36 = extraout_XMM0;
      do {
        iVar7 = v_end - v_start;
        iVar11 = 0x40;
        if (iVar7 < 0x40) {
          iVar11 = iVar7;
        }
        if (0 < iVar7) {
          iVar7 = v_start;
          do {
            iVar18 = (iVar11 + v_start) - iVar7;
            if (3 < iVar18) {
              iVar18 = iVar17;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar18 = iVar17;
            }
            iVar17 = iVar18;
            local_b214 = 0;
            memset(local_b088,0,0xc4);
            memset(local_aee8,0,0xc4);
            memset(local_abb8,0,0x2ae0);
            lVar28 = (long)(iVar7 * dgd_stride) + (-3 - lVar21);
            iVar18 = iVar7 * src_stride;
            uVar14 = (ulong)(uint)h_start;
            if (h_start < (int)(h_end & 0xfffffffeU)) {
              puVar26 = dgd + (long)(iVar7 * dgd_stride) + (h_start - lVar21) + -2;
              local_b214 = 0;
              uVar14 = (long)h_start;
              do {
                lVar24 = uVar14 + lVar28;
                bVar1 = src[uVar14 + (long)iVar18];
                bVar2 = src[uVar14 + (long)iVar18 + 1];
                auVar37 = pshufb(*(undefined1 (*) [16])(dgd + uVar14 + lVar28),_DAT_0050da40);
                in_XMM2 = pmovzxbw(in_XMM2,auVar37);
                auVar38[1] = 0;
                auVar38[0] = auVar37[8];
                auVar38[2] = auVar37[9];
                auVar38[3] = 0;
                auVar38[4] = auVar37[10];
                auVar38[5] = 0;
                auVar38[6] = auVar37[0xb];
                auVar38[7] = 0;
                auVar38[8] = auVar37[0xc];
                auVar38[9] = 0;
                auVar38[10] = auVar37[0xd];
                auVar38[0xb] = 0;
                auVar38[0xc] = auVar37[0xe];
                auVar38[0xd] = 0;
                auVar38[0xe] = auVar37[0xf];
                auVar38[0xf] = 0;
                auVar37 = pshufb(*(undefined1 (*) [16])(dgd + lVar25 + lVar24),_DAT_0050da40);
                auVar50 = pmovzxbw(in_XMM2,auVar37);
                auVar39[1] = 0;
                auVar39[0] = auVar37[8];
                auVar39[2] = auVar37[9];
                auVar39[3] = 0;
                auVar39[4] = auVar37[10];
                auVar39[5] = 0;
                auVar39[6] = auVar37[0xb];
                auVar39[7] = 0;
                auVar39[8] = auVar37[0xc];
                auVar39[9] = 0;
                auVar39[10] = auVar37[0xd];
                auVar39[0xb] = 0;
                auVar39[0xc] = auVar37[0xe];
                auVar39[0xd] = 0;
                auVar39[0xe] = auVar37[0xf];
                auVar39[0xf] = 0;
                auVar37 = pshufb(*(undefined1 (*) [16])(dgd + lVar25 * 2 + lVar24),_DAT_0050da40);
                auVar51 = pmovzxbw(auVar50,auVar37);
                auVar40[1] = 0;
                auVar40[0] = auVar37[8];
                auVar40[2] = auVar37[9];
                auVar40[3] = 0;
                auVar40[4] = auVar37[10];
                auVar40[5] = 0;
                auVar40[6] = auVar37[0xb];
                auVar40[7] = 0;
                auVar40[8] = auVar37[0xc];
                auVar40[9] = 0;
                auVar40[10] = auVar37[0xd];
                auVar40[0xb] = 0;
                auVar40[0xc] = auVar37[0xe];
                auVar40[0xd] = 0;
                auVar40[0xe] = auVar37[0xf];
                auVar40[0xf] = 0;
                auVar37 = pshufb(*(undefined1 (*) [16])(dgd + lVar21 + lVar24),_DAT_0050da40);
                auVar52 = pmovzxbw(auVar51,auVar37);
                auVar41[1] = 0;
                auVar41[0] = auVar37[8];
                auVar41[2] = auVar37[9];
                auVar41[3] = 0;
                auVar41[4] = auVar37[10];
                auVar41[5] = 0;
                auVar41[6] = auVar37[0xb];
                auVar41[7] = 0;
                auVar41[8] = auVar37[0xc];
                auVar41[9] = 0;
                auVar41[10] = auVar37[0xd];
                auVar41[0xb] = 0;
                auVar41[0xc] = auVar37[0xe];
                auVar41[0xd] = 0;
                auVar41[0xe] = auVar37[0xf];
                auVar41[0xf] = 0;
                auVar37 = pshufb(*(undefined1 (*) [16])(dgd + lVar25 * 4 + lVar24),_DAT_0050da40);
                auVar53 = pmovzxbw(auVar52,auVar37);
                auVar42[1] = 0;
                auVar42[0] = auVar37[8];
                auVar42[2] = auVar37[9];
                auVar42[3] = 0;
                auVar42[4] = auVar37[10];
                auVar42[5] = 0;
                auVar42[6] = auVar37[0xb];
                auVar42[7] = 0;
                auVar42[8] = auVar37[0xc];
                auVar42[9] = 0;
                auVar42[10] = auVar37[0xd];
                auVar42[0xb] = 0;
                auVar42[0xc] = auVar37[0xe];
                auVar42[0xd] = 0;
                auVar42[0xe] = auVar37[0xf];
                auVar42[0xf] = 0;
                auVar37 = pshufb(*(undefined1 (*) [16])(dgd + lVar25 * 5 + lVar24),_DAT_0050da40);
                auVar54 = pmovzxbw(auVar53,auVar37);
                auVar43[1] = 0;
                auVar43[0] = auVar37[8];
                auVar43[2] = auVar37[9];
                auVar43[3] = 0;
                auVar43[4] = auVar37[10];
                auVar43[5] = 0;
                auVar43[6] = auVar37[0xb];
                auVar43[7] = 0;
                auVar43[8] = auVar37[0xc];
                auVar43[9] = 0;
                auVar43[10] = auVar37[0xd];
                auVar43[0xb] = 0;
                auVar43[0xc] = auVar37[0xe];
                auVar43[0xd] = 0;
                auVar43[0xe] = auVar37[0xf];
                auVar43[0xf] = 0;
                auVar60 = pshufb(*(undefined1 (*) [16])(dgd + lVar25 * 6 + lVar24),_DAT_0050da40);
                auVar37 = pmovzxbw(auVar43,auVar60);
                auVar61[1] = 0;
                auVar61[0] = auVar60[8];
                auVar61[2] = auVar60[9];
                auVar61[3] = 0;
                auVar61[4] = auVar60[10];
                auVar61[5] = 0;
                auVar61[6] = auVar60[0xb];
                auVar61[7] = 0;
                auVar61[8] = auVar60[0xc];
                auVar61[9] = 0;
                auVar61[10] = auVar60[0xd];
                auVar61[0xb] = 0;
                auVar61[0xc] = auVar60[0xe];
                auVar61[0xd] = 0;
                auVar61[0xe] = auVar60[0xf];
                auVar61[0xf] = 0;
                piVar10 = local_aae8;
                puVar35 = local_b088;
                puVar34 = local_aee8;
                lVar9 = 0;
                puVar31 = puVar26;
                do {
                  uVar19 = (uint)dgd[lVar9 * lVar25 + lVar24];
                  lVar13 = 0;
                  piVar20 = piVar10;
                  do {
                    bVar3 = puVar31[lVar13];
                    *(uint *)(puVar35 + lVar13 * 4) =
                         *(int *)(puVar35 + lVar13 * 4) + bVar3 + uVar19;
                    *(uint *)(puVar34 + lVar13 * 4) =
                         *(int *)(puVar34 + lVar13 * 4) + (uint)bVar3 * (uint)bVar2 + uVar19 * bVar1
                    ;
                    uVar29 = *(ushort *)(puVar31 + lVar13 + -1);
                    auVar60 = pshuflw(ZEXT216(uVar29),ZEXT216(uVar29),0);
                    auVar59 = pmovzxbw(auVar60,auVar60);
                    auVar62 = pmaddwd(auVar59,in_XMM2);
                    auVar60 = pmaddwd(auVar59,auVar38);
                    piVar20[-0x34] = auVar62._0_4_ + piVar20[-0x34];
                    piVar20[-0x33] = auVar62._4_4_ + piVar20[-0x33];
                    piVar20[-0x32] = auVar62._8_4_ + piVar20[-0x32];
                    piVar20[-0x31] = auVar62._12_4_ + piVar20[-0x31];
                    piVar20[-0x30] = auVar60._0_4_ + piVar20[-0x30];
                    piVar20[-0x2f] = auVar60._4_4_ + piVar20[-0x2f];
                    piVar20[-0x2e] = auVar60._8_4_ + piVar20[-0x2e];
                    piVar20[-0x2d] = auVar60._12_4_ + piVar20[-0x2d];
                    auVar60 = pmaddwd(auVar59,auVar50);
                    auVar62 = pmaddwd(auVar59,auVar39);
                    piVar20[-0x2c] = auVar60._0_4_ + piVar20[-0x2c];
                    piVar20[-0x2b] = auVar60._4_4_ + piVar20[-0x2b];
                    piVar20[-0x2a] = auVar60._8_4_ + piVar20[-0x2a];
                    piVar20[-0x29] = auVar60._12_4_ + piVar20[-0x29];
                    piVar20[-0x28] = auVar62._0_4_ + piVar20[-0x28];
                    piVar20[-0x27] = auVar62._4_4_ + piVar20[-0x27];
                    piVar20[-0x26] = auVar62._8_4_ + piVar20[-0x26];
                    piVar20[-0x25] = auVar62._12_4_ + piVar20[-0x25];
                    auVar60 = pmaddwd(auVar59,auVar51);
                    auVar62 = pmaddwd(auVar59,auVar40);
                    piVar20[-0x24] = auVar60._0_4_ + piVar20[-0x24];
                    piVar20[-0x23] = auVar60._4_4_ + piVar20[-0x23];
                    piVar20[-0x22] = auVar60._8_4_ + piVar20[-0x22];
                    piVar20[-0x21] = auVar60._12_4_ + piVar20[-0x21];
                    piVar20[-0x20] = auVar62._0_4_ + piVar20[-0x20];
                    piVar20[-0x1f] = auVar62._4_4_ + piVar20[-0x1f];
                    piVar20[-0x1e] = auVar62._8_4_ + piVar20[-0x1e];
                    piVar20[-0x1d] = auVar62._12_4_ + piVar20[-0x1d];
                    auVar60 = pmaddwd(auVar59,auVar52);
                    auVar62 = pmaddwd(auVar59,auVar41);
                    piVar20[-0x1c] = auVar60._0_4_ + piVar20[-0x1c];
                    piVar20[-0x1b] = auVar60._4_4_ + piVar20[-0x1b];
                    piVar20[-0x1a] = auVar60._8_4_ + piVar20[-0x1a];
                    piVar20[-0x19] = auVar60._12_4_ + piVar20[-0x19];
                    piVar20[-0x18] = auVar62._0_4_ + piVar20[-0x18];
                    piVar20[-0x17] = auVar62._4_4_ + piVar20[-0x17];
                    piVar20[-0x16] = auVar62._8_4_ + piVar20[-0x16];
                    piVar20[-0x15] = auVar62._12_4_ + piVar20[-0x15];
                    auVar60 = pmaddwd(auVar59,auVar53);
                    auVar62 = pmaddwd(auVar59,auVar42);
                    piVar20[-0x14] = auVar60._0_4_ + piVar20[-0x14];
                    piVar20[-0x13] = auVar60._4_4_ + piVar20[-0x13];
                    piVar20[-0x12] = auVar60._8_4_ + piVar20[-0x12];
                    piVar20[-0x11] = auVar60._12_4_ + piVar20[-0x11];
                    piVar20[-0x10] = auVar62._0_4_ + piVar20[-0x10];
                    piVar20[-0xf] = auVar62._4_4_ + piVar20[-0xf];
                    piVar20[-0xe] = auVar62._8_4_ + piVar20[-0xe];
                    piVar20[-0xd] = auVar62._12_4_ + piVar20[-0xd];
                    auVar60 = pmaddwd(auVar59,auVar54);
                    auVar62 = pmaddwd(auVar59,auVar43);
                    piVar20[-0xc] = auVar60._0_4_ + piVar20[-0xc];
                    piVar20[-0xb] = auVar60._4_4_ + piVar20[-0xb];
                    piVar20[-10] = auVar60._8_4_ + piVar20[-10];
                    piVar20[-9] = auVar60._12_4_ + piVar20[-9];
                    piVar20[-8] = auVar62._0_4_ + piVar20[-8];
                    piVar20[-7] = auVar62._4_4_ + piVar20[-7];
                    piVar20[-6] = auVar62._8_4_ + piVar20[-6];
                    piVar20[-5] = auVar62._12_4_ + piVar20[-5];
                    auVar60 = pmaddwd(auVar59,auVar37);
                    auVar59 = pmaddwd(auVar59,auVar61);
                    piVar20[-4] = auVar60._0_4_ + piVar20[-4];
                    piVar20[-3] = auVar60._4_4_ + piVar20[-3];
                    piVar20[-2] = auVar60._8_4_ + piVar20[-2];
                    piVar20[-1] = auVar60._12_4_ + piVar20[-1];
                    *piVar20 = auVar59._0_4_ + *piVar20;
                    piVar20[1] = auVar59._4_4_ + piVar20[1];
                    piVar20[2] = auVar59._8_4_ + piVar20[2];
                    piVar20[3] = auVar59._12_4_ + piVar20[3];
                    lVar13 = lVar13 + 1;
                    uVar19 = (uint)(uVar29 >> 8);
                    piVar20 = piVar20 + 0x188;
                  } while (lVar13 != 7);
                  lVar9 = lVar9 + 1;
                  puVar34 = puVar34 + 0x1c;
                  puVar35 = puVar35 + 0x1c;
                  puVar31 = puVar31 + lVar25;
                  piVar10 = piVar10 + 0x38;
                } while (lVar9 != 7);
                local_b214 = local_b214 + (uint)bVar1 + (uint)bVar2;
                uVar14 = uVar14 + 2;
                puVar26 = puVar26 + 2;
              } while ((long)uVar14 < (long)(int)(h_end & 0xfffffffeU));
            }
            if ((h_end & 1U) != 0) {
              lVar24 = (long)(int)uVar14;
              puVar26 = dgd + lVar24 + lVar28;
              bVar1 = src[lVar24 + iVar18];
              auVar37 = pshufb(*(undefined1 (*) [16])(dgd + lVar24 + lVar28),_DAT_0050da40);
              in_XMM2 = pmovzxbw(in_XMM2,auVar37);
              auVar44[1] = 0;
              auVar44[0] = auVar37[8];
              auVar44[2] = auVar37[9];
              auVar44[3] = 0;
              auVar44[4] = auVar37[10];
              auVar44[5] = 0;
              auVar44[6] = auVar37[0xb];
              auVar44[7] = 0;
              auVar44[8] = auVar37[0xc];
              auVar44[9] = 0;
              auVar44[10] = auVar37[0xd];
              auVar44[0xb] = 0;
              auVar44[0xc] = auVar37[0xe];
              auVar44[0xd] = 0;
              auVar44[0xe] = auVar37[0xf];
              auVar44[0xf] = 0;
              auVar37 = pshufb(*(undefined1 (*) [16])(puVar26 + lVar25),_DAT_0050da40);
              auVar50 = pmovzxbw(in_XMM2,auVar37);
              auVar45[1] = 0;
              auVar45[0] = auVar37[8];
              auVar45[2] = auVar37[9];
              auVar45[3] = 0;
              auVar45[4] = auVar37[10];
              auVar45[5] = 0;
              auVar45[6] = auVar37[0xb];
              auVar45[7] = 0;
              auVar45[8] = auVar37[0xc];
              auVar45[9] = 0;
              auVar45[10] = auVar37[0xd];
              auVar45[0xb] = 0;
              auVar45[0xc] = auVar37[0xe];
              auVar45[0xd] = 0;
              auVar45[0xe] = auVar37[0xf];
              auVar45[0xf] = 0;
              auVar37 = pshufb(*(undefined1 (*) [16])(puVar26 + lVar25 * 2),_DAT_0050da40);
              auVar51 = pmovzxbw(auVar50,auVar37);
              auVar46[1] = 0;
              auVar46[0] = auVar37[8];
              auVar46[2] = auVar37[9];
              auVar46[3] = 0;
              auVar46[4] = auVar37[10];
              auVar46[5] = 0;
              auVar46[6] = auVar37[0xb];
              auVar46[7] = 0;
              auVar46[8] = auVar37[0xc];
              auVar46[9] = 0;
              auVar46[10] = auVar37[0xd];
              auVar46[0xb] = 0;
              auVar46[0xc] = auVar37[0xe];
              auVar46[0xd] = 0;
              auVar46[0xe] = auVar37[0xf];
              auVar46[0xf] = 0;
              auVar37 = pshufb(*(undefined1 (*) [16])(puVar26 + lVar21),_DAT_0050da40);
              auVar52 = pmovzxbw(auVar51,auVar37);
              auVar47[1] = 0;
              auVar47[0] = auVar37[8];
              auVar47[2] = auVar37[9];
              auVar47[3] = 0;
              auVar47[4] = auVar37[10];
              auVar47[5] = 0;
              auVar47[6] = auVar37[0xb];
              auVar47[7] = 0;
              auVar47[8] = auVar37[0xc];
              auVar47[9] = 0;
              auVar47[10] = auVar37[0xd];
              auVar47[0xb] = 0;
              auVar47[0xc] = auVar37[0xe];
              auVar47[0xd] = 0;
              auVar47[0xe] = auVar37[0xf];
              auVar47[0xf] = 0;
              auVar37 = pshufb(*(undefined1 (*) [16])(puVar26 + lVar25 * 4),_DAT_0050da40);
              auVar53 = pmovzxbw(auVar52,auVar37);
              auVar48[1] = 0;
              auVar48[0] = auVar37[8];
              auVar48[2] = auVar37[9];
              auVar48[3] = 0;
              auVar48[4] = auVar37[10];
              auVar48[5] = 0;
              auVar48[6] = auVar37[0xb];
              auVar48[7] = 0;
              auVar48[8] = auVar37[0xc];
              auVar48[9] = 0;
              auVar48[10] = auVar37[0xd];
              auVar48[0xb] = 0;
              auVar48[0xc] = auVar37[0xe];
              auVar48[0xd] = 0;
              auVar48[0xe] = auVar37[0xf];
              auVar48[0xf] = 0;
              auVar37 = pshufb(*(undefined1 (*) [16])(puVar26 + lVar25 * 5),_DAT_0050da40);
              auVar54 = pmovzxbw(auVar53,auVar37);
              auVar49[1] = 0;
              auVar49[0] = auVar37[8];
              auVar49[2] = auVar37[9];
              auVar49[3] = 0;
              auVar49[4] = auVar37[10];
              auVar49[5] = 0;
              auVar49[6] = auVar37[0xb];
              auVar49[7] = 0;
              auVar49[8] = auVar37[0xc];
              auVar49[9] = 0;
              auVar49[10] = auVar37[0xd];
              auVar49[0xb] = 0;
              auVar49[0xc] = auVar37[0xe];
              auVar49[0xd] = 0;
              auVar49[0xe] = auVar37[0xf];
              auVar49[0xf] = 0;
              auVar60 = pshufb(*(undefined1 (*) [16])(puVar26 + lVar25 * 6),_DAT_0050da40);
              auVar37 = pmovzxbw(auVar49,auVar60);
              auVar63[1] = 0;
              auVar63[0] = auVar60[8];
              auVar63[2] = auVar60[9];
              auVar63[3] = 0;
              auVar63[4] = auVar60[10];
              auVar63[5] = 0;
              auVar63[6] = auVar60[0xb];
              auVar63[7] = 0;
              auVar63[8] = auVar60[0xc];
              auVar63[9] = 0;
              auVar63[10] = auVar60[0xd];
              auVar63[0xb] = 0;
              auVar63[0xc] = auVar60[0xe];
              auVar63[0xd] = 0;
              auVar63[0xe] = auVar60[0xf];
              auVar63[0xf] = 0;
              piVar10 = local_aae8;
              puVar35 = local_b088;
              puVar34 = local_aee8;
              lVar28 = 0;
              do {
                lVar24 = 0;
                piVar20 = piVar10;
                do {
                  uVar29 = (ushort)puVar26[lVar24];
                  uVar19 = (uint)uVar29;
                  auVar60 = pshuflw(ZEXT416(uVar19),ZEXT416(uVar19),0);
                  auVar59 = pmovzxbw(auVar60,auVar60);
                  auVar62 = pmaddwd(auVar59,in_XMM2);
                  auVar60 = pmaddwd(auVar59,auVar44);
                  piVar20[-0x34] = auVar62._0_4_ + piVar20[-0x34];
                  piVar20[-0x33] = auVar62._4_4_ + piVar20[-0x33];
                  piVar20[-0x32] = auVar62._8_4_ + piVar20[-0x32];
                  piVar20[-0x31] = auVar62._12_4_ + piVar20[-0x31];
                  piVar20[-0x30] = auVar60._0_4_ + piVar20[-0x30];
                  piVar20[-0x2f] = auVar60._4_4_ + piVar20[-0x2f];
                  piVar20[-0x2e] = auVar60._8_4_ + piVar20[-0x2e];
                  piVar20[-0x2d] = auVar60._12_4_ + piVar20[-0x2d];
                  auVar60 = pmaddwd(auVar59,auVar50);
                  auVar62 = pmaddwd(auVar59,auVar45);
                  piVar20[-0x2c] = auVar60._0_4_ + piVar20[-0x2c];
                  piVar20[-0x2b] = auVar60._4_4_ + piVar20[-0x2b];
                  piVar20[-0x2a] = auVar60._8_4_ + piVar20[-0x2a];
                  piVar20[-0x29] = auVar60._12_4_ + piVar20[-0x29];
                  piVar20[-0x28] = auVar62._0_4_ + piVar20[-0x28];
                  piVar20[-0x27] = auVar62._4_4_ + piVar20[-0x27];
                  piVar20[-0x26] = auVar62._8_4_ + piVar20[-0x26];
                  piVar20[-0x25] = auVar62._12_4_ + piVar20[-0x25];
                  auVar60 = pmaddwd(auVar59,auVar51);
                  auVar62 = pmaddwd(auVar59,auVar46);
                  piVar20[-0x24] = auVar60._0_4_ + piVar20[-0x24];
                  piVar20[-0x23] = auVar60._4_4_ + piVar20[-0x23];
                  piVar20[-0x22] = auVar60._8_4_ + piVar20[-0x22];
                  piVar20[-0x21] = auVar60._12_4_ + piVar20[-0x21];
                  piVar20[-0x20] = auVar62._0_4_ + piVar20[-0x20];
                  piVar20[-0x1f] = auVar62._4_4_ + piVar20[-0x1f];
                  piVar20[-0x1e] = auVar62._8_4_ + piVar20[-0x1e];
                  piVar20[-0x1d] = auVar62._12_4_ + piVar20[-0x1d];
                  auVar60 = pmaddwd(auVar59,auVar52);
                  auVar62 = pmaddwd(auVar59,auVar47);
                  piVar20[-0x1c] = auVar60._0_4_ + piVar20[-0x1c];
                  piVar20[-0x1b] = auVar60._4_4_ + piVar20[-0x1b];
                  piVar20[-0x1a] = auVar60._8_4_ + piVar20[-0x1a];
                  piVar20[-0x19] = auVar60._12_4_ + piVar20[-0x19];
                  piVar20[-0x18] = auVar62._0_4_ + piVar20[-0x18];
                  piVar20[-0x17] = auVar62._4_4_ + piVar20[-0x17];
                  piVar20[-0x16] = auVar62._8_4_ + piVar20[-0x16];
                  piVar20[-0x15] = auVar62._12_4_ + piVar20[-0x15];
                  auVar60 = pmaddwd(auVar59,auVar53);
                  auVar62 = pmaddwd(auVar59,auVar48);
                  piVar20[-0x14] = auVar60._0_4_ + piVar20[-0x14];
                  piVar20[-0x13] = auVar60._4_4_ + piVar20[-0x13];
                  piVar20[-0x12] = auVar60._8_4_ + piVar20[-0x12];
                  piVar20[-0x11] = auVar60._12_4_ + piVar20[-0x11];
                  piVar20[-0x10] = auVar62._0_4_ + piVar20[-0x10];
                  piVar20[-0xf] = auVar62._4_4_ + piVar20[-0xf];
                  piVar20[-0xe] = auVar62._8_4_ + piVar20[-0xe];
                  piVar20[-0xd] = auVar62._12_4_ + piVar20[-0xd];
                  auVar60 = pmaddwd(auVar59,auVar54);
                  auVar62 = pmaddwd(auVar59,auVar49);
                  piVar20[-0xc] = auVar60._0_4_ + piVar20[-0xc];
                  piVar20[-0xb] = auVar60._4_4_ + piVar20[-0xb];
                  piVar20[-10] = auVar60._8_4_ + piVar20[-10];
                  piVar20[-9] = auVar60._12_4_ + piVar20[-9];
                  piVar20[-8] = auVar62._0_4_ + piVar20[-8];
                  piVar20[-7] = auVar62._4_4_ + piVar20[-7];
                  piVar20[-6] = auVar62._8_4_ + piVar20[-6];
                  piVar20[-5] = auVar62._12_4_ + piVar20[-5];
                  auVar60 = pmaddwd(auVar59,auVar37);
                  auVar59 = pmaddwd(auVar59,auVar63);
                  iVar18 = *piVar20;
                  iVar30 = piVar20[1];
                  iVar4 = piVar20[2];
                  iVar5 = piVar20[3];
                  piVar20[-4] = auVar60._0_4_ + piVar20[-4];
                  piVar20[-3] = auVar60._4_4_ + piVar20[-3];
                  piVar20[-2] = auVar60._8_4_ + piVar20[-2];
                  piVar20[-1] = auVar60._12_4_ + piVar20[-1];
                  *(uint *)(puVar35 + lVar24 * 4) = *(int *)(puVar35 + lVar24 * 4) + uVar19;
                  *(uint *)(puVar34 + lVar24 * 4) =
                       *(int *)(puVar34 + lVar24 * 4) + (uint)uVar29 * (uint)bVar1;
                  *piVar20 = auVar59._0_4_ + iVar18;
                  piVar20[1] = auVar59._4_4_ + iVar30;
                  piVar20[2] = auVar59._8_4_ + iVar4;
                  piVar20[3] = auVar59._12_4_ + iVar5;
                  lVar24 = lVar24 + 1;
                  piVar20 = piVar20 + 0x188;
                } while (lVar24 != 7);
                lVar28 = lVar28 + 1;
                puVar34 = puVar34 + 0x1c;
                puVar35 = puVar35 + 0x1c;
                puVar26 = puVar26 + lVar25;
                piVar10 = piVar10 + 0x38;
              } while (lVar28 != 7);
              local_b214 = local_b214 + (uint)bVar1;
            }
            puVar35 = local_b088;
            puVar34 = local_afb8;
            puVar15 = local_aee8;
            puVar22 = local_ae18;
            lVar28 = 0;
            do {
              lVar24 = 0;
              do {
                *(int *)(puVar34 + lVar24 * 4) =
                     *(int *)(puVar34 + lVar24 * 4) + *(int *)(puVar35 + lVar24 * 4) * iVar17;
                *(int *)(puVar22 + lVar24 * 4) =
                     *(int *)(puVar22 + lVar24 * 4) + *(int *)(puVar15 + lVar24 * 4) * iVar17;
                lVar24 = lVar24 + 1;
              } while (lVar24 != 7);
              lVar28 = lVar28 + 1;
              puVar22 = puVar22 + 0x1c;
              puVar15 = puVar15 + 0x1c;
              puVar34 = puVar34 + 0x1c;
              puVar35 = puVar35 + 0x1c;
            } while (lVar28 != 7);
            auVar36._4_4_ = iVar17;
            auVar36._0_4_ = iVar17;
            auVar36._8_4_ = iVar17;
            auVar36._12_4_ = iVar17;
            puVar35 = local_80d8;
            puVar34 = local_abb8;
            lVar28 = 0;
            do {
              lVar24 = 0;
              do {
                auVar37 = pmulld(*(undefined1 (*) [16])(puVar34 + lVar24 * 4),auVar36);
                piVar10 = (int *)(puVar35 + lVar24 * 4);
                iVar18 = piVar10[1];
                iVar30 = piVar10[2];
                iVar4 = piVar10[3];
                piVar20 = (int *)(puVar35 + lVar24 * 4);
                *piVar20 = auVar37._0_4_ + *piVar10;
                piVar20[1] = auVar37._4_4_ + iVar18;
                piVar20[2] = auVar37._8_4_ + iVar30;
                piVar20[3] = auVar37._12_4_ + iVar4;
                lVar24 = lVar24 + 4;
              } while (lVar24 != 0x38);
              lVar28 = lVar28 + 1;
              puVar34 = puVar34 + 0xe0;
              puVar35 = puVar35 + 0xe0;
            } while (lVar28 != 0x31);
            iVar23 = iVar23 + local_b214 * iVar17;
            iVar7 = iVar7 + iVar17;
          } while (iVar7 < iVar11 + v_start);
        }
        puVar35 = local_ae18;
        plVar12 = local_ad48;
        lVar28 = 0;
        do {
          lVar24 = 0;
          do {
            plVar12[lVar24] = plVar12[lVar24] + (long)*(int *)(puVar35 + lVar24 * 4);
            *(undefined4 *)(puVar35 + lVar24 * 4) = 0;
            lVar24 = lVar24 + 1;
          } while (lVar24 != 7);
          lVar28 = lVar28 + 1;
          plVar12 = plVar12 + 7;
          puVar35 = puVar35 + 0x1c;
        } while (lVar28 != 7);
        puVar35 = local_55f8;
        puVar34 = local_80d8;
        lVar28 = 0;
        do {
          lVar24 = 0;
          do {
            auVar37 = pmovsxdq(auVar36,*(undefined8 *)(puVar34 + lVar24 * 4));
            auVar36._0_8_ = auVar37._0_8_ + *(long *)(puVar35 + lVar24 * 8);
            auVar36._8_8_ = auVar37._8_8_ + *(long *)((long)(puVar35 + lVar24 * 8) + 8);
            *(undefined1 (*) [16])(puVar35 + lVar24 * 8) = auVar36;
            *(undefined8 *)(puVar34 + lVar24 * 4) = 0;
            lVar24 = lVar24 + 2;
          } while (lVar24 != 0x38);
          lVar28 = lVar28 + 1;
          puVar34 = puVar34 + 0xe0;
          puVar35 = puVar35 + 0x1c0;
        } while (lVar28 != 0x31);
        v_start = v_start + 0x40;
      } while (v_start < v_end);
    }
    uVar8 = uVar8 / uVar32 & 0xff;
    lVar21 = uVar32 * uVar8 * uVar8;
    lVar25 = 0;
    puVar35 = local_55f8;
    do {
      lVar28 = 0;
      puVar34 = puVar35;
      piVar27 = H;
      do {
        iVar17 = *(int *)(local_afb8 + lVar28 * 4 + lVar25 * 0x1c);
        M[lVar28 * 7 + lVar25] =
             (local_ad48[lVar25 * 7 + lVar28] + lVar21) - ((long)iVar17 + (long)iVar23) * uVar8;
        piVar10 = (int *)local_afb8;
        lVar24 = 0;
        puVar15 = puVar34;
        piVar33 = piVar27;
        do {
          lVar9 = 0;
          piVar20 = piVar10;
          do {
            *(ulong *)((long)piVar33 + lVar9) =
                 (*(long *)(puVar15 + lVar9 * 8) + lVar21) - ((long)*piVar20 + (long)iVar17) * uVar8
            ;
            lVar9 = lVar9 + 8;
            piVar20 = piVar20 + 7;
          } while (lVar9 != 0x38);
          lVar24 = lVar24 + 1;
          piVar33 = piVar33 + 7;
          piVar10 = piVar10 + 1;
          puVar15 = puVar15 + 8;
        } while (lVar24 != 7);
        lVar28 = lVar28 + 1;
        piVar27 = piVar27 + 0x157;
        puVar34 = puVar34 + 0xc40;
      } while (lVar28 != 7);
      lVar25 = lVar25 + 1;
      H = H + 0x31;
      puVar35 = puVar35 + 0x1c0;
    } while (lVar25 != 7);
  }
  return;
}

Assistant:

void av1_compute_stats_sse4_1(int wiener_win, const uint8_t *dgd,
                              const uint8_t *src, int16_t *dgd_avg,
                              int16_t *src_avg, int h_start, int h_end,
                              int v_start, int v_end, int dgd_stride,
                              int src_stride, int64_t *M, int64_t *H,
                              int use_downsampled_wiener_stats) {
  if (wiener_win == WIENER_WIN) {
    compute_stats_win7_opt_sse4_1(dgd, src, h_start, h_end, v_start, v_end,
                                  dgd_stride, src_stride, M, H,
                                  use_downsampled_wiener_stats);
  } else if (wiener_win == WIENER_WIN_CHROMA) {
    compute_stats_win5_opt_sse4_1(dgd, src, h_start, h_end, v_start, v_end,
                                  dgd_stride, src_stride, M, H,
                                  use_downsampled_wiener_stats);
  } else {
    av1_compute_stats_c(wiener_win, dgd, src, dgd_avg, src_avg, h_start, h_end,
                        v_start, v_end, dgd_stride, src_stride, M, H,
                        use_downsampled_wiener_stats);
  }
}